

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O0

void __thiscall
tinyusdz::GeomPrimvar::set_indices
          (GeomPrimvar *this,vector<int,_std::allocator<int>_> *indices,double t)

{
  bool bVar1;
  Sample *local_30;
  Sample *psample;
  double local_20;
  double t_local;
  vector<int,_std::allocator<int>_> *indices_local;
  GeomPrimvar *this_local;
  
  local_20 = t;
  t_local = (double)indices;
  indices_local = (vector<int,_std::allocator<int>_> *)this;
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)&psample,t);
  bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)&psample);
  if (bVar1) {
    std::vector<int,_std::allocator<int>_>::operator=
              (&this->_indices,(vector<int,_std::allocator<int>_> *)t_local);
  }
  else {
    local_30 = (Sample *)0x0;
    bVar1 = TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::get_sample_at
                      (&this->_ts_indices,local_20,&local_30);
    if (bVar1) {
      std::vector<int,_std::allocator<int>_>::operator=
                (&local_30->value,(vector<int,_std::allocator<int>_> *)t_local);
    }
    else {
      TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::add_sample
                (&this->_ts_indices,local_20,(vector<int,_std::allocator<int>_> *)t_local);
    }
  }
  return;
}

Assistant:

void GeomPrimvar::set_indices(const std::vector<int32_t> &indices, const double t) {
  if (value::TimeCode(t).is_default()) {
    _indices = indices;
  } else {
    TypedTimeSamples<std::vector<int32_t>>::Sample *psample{nullptr};
    if (_ts_indices.get_sample_at(t, &psample)) {
      // overwrite content
      psample->value = indices;
    } else {
      _ts_indices.add_sample(t, indices);
    }
  }
}